

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::getDataRange_uvec3
          (GLAttributeBuffer *this,size_t start,size_t count)

{
  RenderDataType RVar1;
  AttributeBuffer *in_RSI;
  vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
  *in_RDI;
  size_t unaff_retaddr;
  GLAttributeBuffer *in_stack_00000008;
  allocator local_41;
  string local_40 [48];
  vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
  *count_00;
  
  count_00 = in_RDI;
  RVar1 = AttributeBuffer::getType(in_RSI);
  if (RVar1 != Vector3UInt) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"bad getData type",&local_41);
    exception((string *)in_RSI);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  getDataRange_helper<glm::vec<3,unsigned_int,(glm::qualifier)0>>
            (in_stack_00000008,unaff_retaddr,(size_t)count_00);
  return in_RDI;
}

Assistant:

std::vector<glm::uvec3> GLAttributeBuffer::getDataRange_uvec3(size_t start, size_t count) {
  if (getType() != RenderDataType::Vector3UInt) exception("bad getData type");
  return getDataRange_helper<glm::uvec3>(start, count);
}